

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

index __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
::calculate_descending_dimension_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
           *this,array<long,_3UL> *stride_list,array<unsigned_long,_3UL> *extent_list,
          general_storage_order<3UL> *storage)

{
  bool bVar1;
  index iVar2;
  long lVar3;
  
  bVar1 = general_storage_order<3UL>::all_dims_ascending(storage);
  if (bVar1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if ((storage->ascending_).elems[lVar3] == false) {
        iVar2 = iVar2 - (extent_list->elems[lVar3] - 1) * stride_list->elems[lVar3];
      }
    }
  }
  return iVar2;
}

Assistant:

index
  calculate_descending_dimension_offset(const StrideList& stride_list,
                                const ExtentList& extent_list,
                                const general_storage_order<NumDims>& storage)
  {
    index offset = 0;
    if (!storage.all_dims_ascending()) 
      for (size_type n = 0; n != NumDims; ++n)
        if (!storage.ascending(n))
          offset -= (extent_list[n] - 1) * stride_list[n];

    return offset;
  }